

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

int __thiscall Clasp::UncoreMinimize::init(UncoreMinimize *this,EVP_PKEY_CTX *ctx)

{
  SharedData *pSVar1;
  
  releaseLits(this);
  (this->fix_).ebo_.size = 0;
  this->eRoot_ = 0;
  this->aTop_ = 0;
  pSVar1 = (this->super_MinimizeConstraint).shared_;
  this->upper_ = **(wsum_t **)
                   ((long)&pSVar1->up_[0].ebo_.buf +
                   (ulong)(((pSVar1->gCount_).super___atomic_base<unsigned_int>._M_i & 1) << 4));
  this->lower_ = 0;
  *(undefined8 *)&this->gen_ = 0xc000000000000000;
  this->actW_ = 1;
  this->nextW_ = 0;
  return 0;
}

Assistant:

void UncoreMinimize::init() {
	releaseLits();
	fix_.clear();
	eRoot_ = 0;
	aTop_  = 0;
	upper_ = shared_->upper(0);
	lower_ = 0;
	gen_   = 0;
	level_ = 0;
	next_  = 0;
	disj_  = 0;
	path_  = 1;
	init_  = 1;
	actW_  = 1;
	nextW_ = 0;
}